

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DestroyDB(leveldb *this,string *dbname,Options *options)

{
  Env *pEVar1;
  Status SVar2;
  bool bVar3;
  char *pcVar4;
  reference filename;
  Status local_100;
  Status local_f8;
  Status local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8 [32];
  Status local_a8;
  Status del;
  size_t i;
  FileType type;
  uint64_t number;
  leveldb local_80 [8];
  string lockname;
  undefined8 local_60;
  FileLock *lock;
  Status local_48;
  Status result;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  Env *env;
  Options *options_local;
  string *dbname_local;
  
  pEVar1 = options->env;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&result);
  (*pEVar1->_vptr_Env[7])
            (&local_48,pEVar1,dbname,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&result);
  bVar3 = Status::ok(&local_48);
  if (bVar3) {
    LockFileName(local_80,dbname);
    (*pEVar1->_vptr_Env[0xd])(&number,pEVar1,local_80,&local_60);
    Status::operator=(&local_48,(Status *)&number);
    Status::~Status((Status *)&number);
    bVar3 = Status::ok(&local_48);
    if (bVar3) {
      for (del.state_ = (char *)0x0; SVar2.state_ = del.state_,
          pcVar4 = (char *)std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&result), SVar2.state_ < pcVar4; del.state_ = del.state_ + 1) {
        filename = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&result,(size_type)del.state_);
        bVar3 = ParseFileName(filename,(uint64_t *)&stack0xffffffffffffff70,
                              (FileType *)((long)&i + 4));
        if ((bVar3) && (i._4_4_ != 1)) {
          std::operator+(local_e8,(char *)dbname);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&result,(size_type)del.state_);
          std::operator+(local_c8,local_e8);
          (*pEVar1->_vptr_Env[8])(&local_a8,pEVar1,local_c8);
          std::__cxx11::string::~string((string *)local_c8);
          std::__cxx11::string::~string((string *)local_e8);
          bVar3 = Status::ok(&local_48);
          if ((bVar3) && (bVar3 = Status::ok(&local_a8), !bVar3)) {
            Status::operator=(&local_48,&local_a8);
          }
          Status::~Status(&local_a8);
        }
      }
      (*pEVar1->_vptr_Env[0xe])(&local_f0,pEVar1,local_60);
      Status::~Status(&local_f0);
      (*pEVar1->_vptr_Env[8])(&local_f8,pEVar1,local_80);
      Status::~Status(&local_f8);
      (*pEVar1->_vptr_Env[10])(&local_100,pEVar1,dbname);
      Status::~Status(&local_100);
    }
    Status::Status((Status *)this,&local_48);
    lock._0_4_ = 1;
    std::__cxx11::string::~string((string *)local_80);
  }
  else {
    Status::OK();
    lock._0_4_ = 1;
  }
  Status::~Status(&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&result);
  return (Status)(char *)this;
}

Assistant:

Status DestroyDB(const std::string& dbname, const Options& options) {
  Env* env = options.env;
  std::vector<std::string> filenames;
  Status result = env->GetChildren(dbname, &filenames);
  if (!result.ok()) {
    // Ignore error in case directory does not exist
    return Status::OK();
  }

  FileLock* lock;
  const std::string lockname = LockFileName(dbname);
  result = env->LockFile(lockname, &lock);
  if (result.ok()) {
    uint64_t number;
    FileType type;
    for (size_t i = 0; i < filenames.size(); i++) {
      if (ParseFileName(filenames[i], &number, &type) &&
          type != kDBLockFile) {  // Lock file will be deleted at end
        Status del = env->DeleteFile(dbname + "/" + filenames[i]);
        if (result.ok() && !del.ok()) {
          result = del;
        }
      }
    }
    env->UnlockFile(lock);  // Ignore error since state is already gone
    env->DeleteFile(lockname);
    env->DeleteDir(dbname);  // Ignore error in case dir contains other files
  }
  return result;
}